

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<unsigned_char,unsigned_char,duckdb::NotEquals,false,false>
                (uchar *ldata,uchar *rdata,SelectionVector *sel,idx_t count,ValidityMask *mask,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  ulong uVar1;
  uchar uVar2;
  uchar uVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  sel_t *psVar7;
  idx_t iVar8;
  sel_t sVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  ulong uVar16;
  bool bVar17;
  
  uVar1 = count + 0x3f;
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (uVar1 < 0x40) {
        lVar11 = 0;
      }
      else {
        puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        lVar11 = 0;
        uVar12 = 0;
        uVar16 = 0;
        do {
          if (puVar4 == (unsigned_long *)0x0) {
            uVar15 = 0xffffffffffffffff;
          }
          else {
            uVar15 = puVar4[uVar12];
          }
          uVar10 = uVar16 + 0x40;
          if (count <= uVar16 + 0x40) {
            uVar10 = count;
          }
          uVar13 = uVar16;
          if (uVar15 == 0xffffffffffffffff) {
            if (uVar16 < uVar10) {
              psVar5 = sel->sel_vector;
              psVar6 = false_sel->sel_vector;
              do {
                uVar13 = uVar16;
                if (psVar5 != (sel_t *)0x0) {
                  uVar13 = (ulong)psVar5[uVar16];
                }
                uVar2 = ldata[uVar16];
                uVar3 = rdata[uVar16];
                psVar6[lVar11] = (sel_t)uVar13;
                lVar11 = lVar11 + (ulong)(uVar2 == uVar3);
                uVar16 = uVar16 + 1;
                uVar13 = uVar16;
              } while (uVar10 != uVar16);
            }
          }
          else if (uVar15 == 0) {
            uVar13 = uVar10;
            if (uVar16 < uVar10) {
              psVar5 = sel->sel_vector;
              psVar6 = false_sel->sel_vector;
              do {
                sVar9 = (sel_t)uVar16;
                if (psVar5 != (sel_t *)0x0) {
                  sVar9 = psVar5[uVar16];
                }
                psVar6[lVar11] = sVar9;
                lVar11 = lVar11 + 1;
                uVar16 = uVar16 + 1;
              } while (uVar10 != uVar16);
            }
          }
          else if (uVar16 < uVar10) {
            psVar5 = sel->sel_vector;
            psVar6 = false_sel->sel_vector;
            uVar13 = 0;
            do {
              if (psVar5 == (sel_t *)0x0) {
                sVar9 = (int)uVar16 + (int)uVar13;
              }
              else {
                sVar9 = psVar5[uVar16 + uVar13];
              }
              if ((uVar15 >> (uVar13 & 0x3f) & 1) == 0) {
                uVar14 = 1;
              }
              else {
                uVar14 = (ulong)(ldata[uVar13 + uVar16] == rdata[uVar13 + uVar16]);
              }
              psVar6[lVar11] = sVar9;
              lVar11 = lVar11 + uVar14;
              uVar13 = uVar13 + 1;
            } while ((uVar16 - uVar10) + uVar13 != 0);
            uVar13 = uVar16 + uVar13;
          }
          uVar12 = uVar12 + 1;
          uVar16 = uVar13;
        } while (uVar12 != uVar1 >> 6);
      }
      return count - lVar11;
    }
    if (0x3f < uVar1) {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar8 = 0;
      uVar12 = 0;
      uVar16 = 0;
      do {
        if (puVar4 == (unsigned_long *)0x0) {
          uVar15 = 0xffffffffffffffff;
        }
        else {
          uVar15 = puVar4[uVar12];
        }
        uVar10 = uVar16 + 0x40;
        if (count <= uVar16 + 0x40) {
          uVar10 = count;
        }
        uVar13 = uVar10;
        if (uVar15 != 0) {
          uVar13 = uVar16;
          if (uVar15 == 0xffffffffffffffff) {
            if (uVar16 < uVar10) {
              psVar5 = sel->sel_vector;
              psVar6 = true_sel->sel_vector;
              do {
                uVar16 = uVar13;
                if (psVar5 != (sel_t *)0x0) {
                  uVar16 = (ulong)psVar5[uVar13];
                }
                uVar2 = ldata[uVar13];
                uVar3 = rdata[uVar13];
                psVar6[iVar8] = (sel_t)uVar16;
                iVar8 = iVar8 + (uVar2 != uVar3);
                uVar13 = uVar13 + 1;
              } while (uVar10 != uVar13);
            }
          }
          else if (uVar16 < uVar10) {
            psVar5 = sel->sel_vector;
            psVar6 = true_sel->sel_vector;
            uVar13 = 0;
            do {
              if (psVar5 == (sel_t *)0x0) {
                sVar9 = (int)uVar16 + (int)uVar13;
              }
              else {
                sVar9 = psVar5[uVar16 + uVar13];
              }
              if ((uVar15 >> (uVar13 & 0x3f) & 1) == 0) {
                uVar14 = 0;
              }
              else {
                uVar14 = (ulong)(ldata[uVar13 + uVar16] != rdata[uVar13 + uVar16]);
              }
              psVar6[iVar8] = sVar9;
              iVar8 = iVar8 + uVar14;
              uVar13 = uVar13 + 1;
            } while ((uVar16 - uVar10) + uVar13 != 0);
            uVar13 = uVar16 + uVar13;
          }
        }
        uVar12 = uVar12 + 1;
        uVar16 = uVar13;
      } while (uVar12 != uVar1 >> 6);
      return iVar8;
    }
  }
  else if (0x3f < uVar1) {
    puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar8 = 0;
    lVar11 = 0;
    uVar12 = 0;
    uVar16 = 0;
    do {
      if (puVar4 == (unsigned_long *)0x0) {
        uVar15 = 0xffffffffffffffff;
      }
      else {
        uVar15 = puVar4[uVar12];
      }
      uVar10 = uVar16 + 0x40;
      if (count <= uVar16 + 0x40) {
        uVar10 = count;
      }
      uVar13 = uVar16;
      if (uVar15 == 0xffffffffffffffff) {
        if (uVar16 < uVar10) {
          psVar5 = sel->sel_vector;
          psVar6 = true_sel->sel_vector;
          psVar7 = false_sel->sel_vector;
          do {
            uVar13 = uVar16;
            if (psVar5 != (sel_t *)0x0) {
              uVar13 = (ulong)psVar5[uVar16];
            }
            uVar2 = ldata[uVar16];
            uVar3 = rdata[uVar16];
            psVar6[iVar8] = (sel_t)uVar13;
            iVar8 = iVar8 + (uVar2 != uVar3);
            psVar7[lVar11] = (sel_t)uVar13;
            lVar11 = lVar11 + (ulong)(uVar2 == uVar3);
            uVar16 = uVar16 + 1;
            uVar13 = uVar16;
          } while (uVar10 != uVar16);
        }
      }
      else if (uVar15 == 0) {
        uVar13 = uVar10;
        if (uVar16 < uVar10) {
          psVar5 = sel->sel_vector;
          psVar6 = false_sel->sel_vector;
          do {
            uVar14 = uVar16;
            if (psVar5 != (sel_t *)0x0) {
              uVar14 = (ulong)psVar5[uVar16];
            }
            psVar6[lVar11] = (sel_t)uVar14;
            lVar11 = lVar11 + 1;
            uVar16 = uVar16 + 1;
          } while (uVar10 != uVar16);
        }
      }
      else if (uVar16 < uVar10) {
        psVar5 = sel->sel_vector;
        psVar6 = true_sel->sel_vector;
        psVar7 = false_sel->sel_vector;
        uVar13 = 0;
        do {
          if (psVar5 == (sel_t *)0x0) {
            sVar9 = (int)uVar16 + (int)uVar13;
          }
          else {
            sVar9 = psVar5[uVar16 + uVar13];
          }
          if ((uVar15 >> (uVar13 & 0x3f) & 1) == 0) {
            bVar17 = false;
          }
          else {
            bVar17 = ldata[uVar13 + uVar16] != rdata[uVar13 + uVar16];
          }
          psVar6[iVar8] = sVar9;
          iVar8 = iVar8 + bVar17;
          psVar7[lVar11] = sVar9;
          lVar11 = lVar11 + (ulong)(bVar17 ^ 1);
          uVar13 = uVar13 + 1;
        } while ((uVar16 - uVar10) + uVar13 != 0);
        uVar13 = uVar16 + uVar13;
      }
      uVar12 = uVar12 + 1;
      uVar16 = uVar13;
    } while (uVar12 != uVar1 >> 6);
    return iVar8;
  }
  return 0;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}